

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cComputeShaderTests.cpp
# Opt level: O0

long __thiscall gl4cts::anon_unknown_0::AdvancedPipelinePostXFB::Run(AdvancedPipelinePostXFB *this)

{
  bool bVar1;
  GLuint GVar2;
  int iVar3;
  int h;
  Vector<float,_4> local_288;
  undefined1 local_278 [8];
  float data_1 [24];
  float ref_data [24];
  float data [24];
  float in_data [24];
  string local_f0;
  char *local_d0;
  char *glsl_cs;
  char *var [2];
  string local_b0;
  allocator<char> local_89;
  string local_88;
  char *local_68;
  char *glsl_fs;
  char *glsl_vs;
  allocator<char> local_41;
  string local_40;
  int local_1c;
  AdvancedPipelinePostXFB *pAStack_18;
  GLint res;
  AdvancedPipelinePostXFB *this_local;
  
  pAStack_18 = this;
  glu::CallLogWrapper::glGetIntegerv
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,0x90d6,&local_1c);
  if (local_1c < 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"GL_MAX_VERTEX_SHADER_STORAGE_BLOCKS <= 0",&local_41);
    deqp::SubcaseBase::OutputNotSupported((SubcaseBase *)this,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    this_local = (AdvancedPipelinePostXFB *)0x0;
  }
  else {
    glsl_fs = 
    "\nlayout(location = 0) in vec4 g_position;\nlayout(location = 1) in vec4 g_color;\nstruct Vertex {\n  vec4 position;\n  vec4 color;\n};\nout StageData {\n  vec4 color;\n} g_vs_out;\nlayout(binding = 0, std430) buffer StageData {\n  Vertex vertex[];\n} g_vs_buffer;\nvoid main() {\n  gl_Position = g_position;\n  g_vs_out.color = g_color;\n  g_vs_buffer.vertex[gl_VertexID].position = g_position;\n  g_vs_buffer.vertex[gl_VertexID].color = g_color;\n}"
    ;
    local_68 = 
    "\nin StageData {\n  vec4 color;\n} g_fs_in;\nlayout(location = 0) out vec4 g_color;\nvoid main() {\n  g_color = g_fs_in.color;\n}"
    ;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_88,
               "\nlayout(location = 0) in vec4 g_position;\nlayout(location = 1) in vec4 g_color;\nstruct Vertex {\n  vec4 position;\n  vec4 color;\n};\nout StageData {\n  vec4 color;\n} g_vs_out;\nlayout(binding = 0, std430) buffer StageData {\n  Vertex vertex[];\n} g_vs_buffer;\nvoid main() {\n  gl_Position = g_position;\n  g_vs_out.color = g_color;\n  g_vs_buffer.vertex[gl_VertexID].position = g_position;\n  g_vs_buffer.vertex[gl_VertexID].color = g_color;\n}"
               ,&local_89);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b0,
               "\nin StageData {\n  vec4 color;\n} g_fs_in;\nlayout(location = 0) out vec4 g_color;\nvoid main() {\n  g_color = g_fs_in.color;\n}"
               ,(allocator<char> *)((long)var + 0xf));
    GVar2 = ComputeShaderBase::CreateProgram(&this->super_ComputeShaderBase,&local_88,&local_b0);
    this->m_program[0] = GVar2;
    std::__cxx11::string::~string((string *)&local_b0);
    std::allocator<char>::~allocator((allocator<char> *)((long)var + 0xf));
    std::__cxx11::string::~string((string *)&local_88);
    std::allocator<char>::~allocator(&local_89);
    glsl_cs = "gl_Position";
    var[0] = "StageData.color";
    glu::CallLogWrapper::glTransformFeedbackVaryings
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,this->m_program[0],2,&glsl_cs,0x8c8c);
    glu::CallLogWrapper::glLinkProgram
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,this->m_program[0]);
    bVar1 = ComputeShaderBase::CheckProgram
                      (&this->super_ComputeShaderBase,this->m_program[0],(bool *)0x0);
    if (bVar1) {
      local_d0 = 
      "\nlayout(local_size_x = 3) in;\nstruct Vertex {\n  vec4 position;\n  vec4 color;\n};\nlayout(binding = 3, std430) buffer Buffer {\n  Vertex g_vertex[3];\n};\nuniform vec4 g_color1 = vec4(0, 0, 1, 0);\nuniform int g_two = 2;\nvoid UpdateVertex2(int i) {\n  g_vertex[i].color -= vec4(-1, 1, 0, 0);\n}\nvoid main() {\n  switch (gl_GlobalInvocationID.x) {\n    case 0: g_vertex[gl_GlobalInvocationID.x].color += vec4(1, 0, 0, 0); break;\n    case 1: g_vertex[1].color += g_color1; break;\n    case 2: UpdateVertex2(g_two); break;\n    default: return;\n  }\n}"
      ;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_f0,
                 "\nlayout(local_size_x = 3) in;\nstruct Vertex {\n  vec4 position;\n  vec4 color;\n};\nlayout(binding = 3, std430) buffer Buffer {\n  Vertex g_vertex[3];\n};\nuniform vec4 g_color1 = vec4(0, 0, 1, 0);\nuniform int g_two = 2;\nvoid UpdateVertex2(int i) {\n  g_vertex[i].color -= vec4(-1, 1, 0, 0);\n}\nvoid main() {\n  switch (gl_GlobalInvocationID.x) {\n    case 0: g_vertex[gl_GlobalInvocationID.x].color += vec4(1, 0, 0, 0); break;\n    case 1: g_vertex[1].color += g_color1; break;\n    case 2: UpdateVertex2(g_two); break;\n    default: return;\n  }\n}"
                 ,(allocator<char> *)((long)in_data + 0x5f));
      GVar2 = ComputeShaderBase::CreateComputeProgram(&this->super_ComputeShaderBase,&local_f0);
      this->m_program[1] = GVar2;
      std::__cxx11::string::~string((string *)&local_f0);
      std::allocator<char>::~allocator((allocator<char> *)((long)in_data + 0x5f));
      glu::CallLogWrapper::glLinkProgram
                (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,this->m_program[1]);
      bVar1 = ComputeShaderBase::CheckProgram
                        (&this->super_ComputeShaderBase,this->m_program[1],(bool *)0x0);
      if (bVar1) {
        glu::CallLogWrapper::glGenBuffers
                  (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,1,&this->m_storage_buffer);
        glu::CallLogWrapper::glBindBufferBase
                  (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0x90d2,0,this->m_storage_buffer);
        glu::CallLogWrapper::glBufferData
                  (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0x90d2,0x60,(void *)0x0,0x88e6);
        glu::CallLogWrapper::glGenBuffers
                  (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,1,&this->m_xfb_buffer);
        glu::CallLogWrapper::glBindBufferBase
                  (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0x8c8e,0,this->m_xfb_buffer);
        glu::CallLogWrapper::glBufferData
                  (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0x8c8e,0x60,(void *)0x0,0x88e2);
        memcpy(data + 0x16,&DAT_029fb170,0x60);
        glu::CallLogWrapper::glGenBuffers
                  (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,1,&this->m_vertex_buffer);
        glu::CallLogWrapper::glBindBuffer
                  (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0x8892,this->m_vertex_buffer);
        glu::CallLogWrapper::glBufferData
                  (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0x8892,0x60,data + 0x16,0x88e4);
        glu::CallLogWrapper::glBindBuffer
                  (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0x8892,0);
        glu::CallLogWrapper::glGenVertexArrays
                  (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,1,&this->m_vertex_array);
        glu::CallLogWrapper::glBindVertexArray
                  (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,this->m_vertex_array);
        glu::CallLogWrapper::glBindBuffer
                  (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0x8892,this->m_vertex_buffer);
        glu::CallLogWrapper::glVertexAttribPointer
                  (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0,4,0x1406,'\0',0x20,(void *)0x0);
        glu::CallLogWrapper::glVertexAttribPointer
                  (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,1,4,0x1406,'\0',0x20,(void *)0x10);
        glu::CallLogWrapper::glBindBuffer
                  (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0x8892,0);
        glu::CallLogWrapper::glEnableVertexAttribArray
                  (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0);
        glu::CallLogWrapper::glEnableVertexAttribArray
                  (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,1);
        glu::CallLogWrapper::glBindVertexArray
                  (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0);
        glu::CallLogWrapper::glClear
                  (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0x4000);
        glu::CallLogWrapper::glUseProgram
                  (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,this->m_program[0]);
        glu::CallLogWrapper::glBindVertexArray
                  (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,this->m_vertex_array);
        glu::CallLogWrapper::glBeginTransformFeedback
                  (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,4);
        glu::CallLogWrapper::glDrawArrays
                  (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,4,0,3);
        glu::CallLogWrapper::glEndTransformFeedback
                  (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper);
        glu::CallLogWrapper::glBindBufferBase
                  (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0x90d2,3,this->m_xfb_buffer);
        glu::CallLogWrapper::glUseProgram
                  (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,this->m_program[1]);
        glu::CallLogWrapper::glDispatchCompute
                  (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,1,1,1);
        glu::CallLogWrapper::glMemoryBarrier
                  (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0x200);
        glu::CallLogWrapper::glBindBuffer
                  (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0x90d2,this->m_storage_buffer);
        glu::CallLogWrapper::glGetBufferSubData
                  (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0x90d2,0,0x60,ref_data + 0x16);
        iVar3 = memcmp(ref_data + 0x16,data + 0x16,0x60);
        if (iVar3 == 0) {
          memcpy(data_1 + 0x16,&DAT_029fb1d0,0x60);
          glu::CallLogWrapper::glGetBufferSubData
                    (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                      super_CallLogWrapper,0x8c8e,0,0x60,local_278);
          iVar3 = memcmp(local_278,data_1 + 0x16,0x60);
          if (iVar3 == 0) {
            iVar3 = ComputeShaderBase::getWindowWidth(&this->super_ComputeShaderBase);
            h = ComputeShaderBase::getWindowHeight(&this->super_ComputeShaderBase);
            tcu::Vector<float,_4>::Vector(&local_288,0.0,1.0,0.0,1.0);
            bVar1 = ComputeShaderBase::ValidateReadBuffer
                              (&this->super_ComputeShaderBase,0,0,iVar3,h,&local_288);
            if (((bVar1 ^ 0xffU) & 1) == 0) {
              this_local = (AdvancedPipelinePostXFB *)0x0;
            }
            else {
              this_local = (AdvancedPipelinePostXFB *)&DAT_ffffffffffffffff;
            }
          }
          else {
            anon_unknown_0::Output("Data in xfb buffer is incorrect.\n");
            this_local = (AdvancedPipelinePostXFB *)&DAT_ffffffffffffffff;
          }
        }
        else {
          anon_unknown_0::Output("Data in shader storage buffer is incorrect.\n");
          this_local = (AdvancedPipelinePostXFB *)&DAT_ffffffffffffffff;
        }
      }
      else {
        this_local = (AdvancedPipelinePostXFB *)&DAT_ffffffffffffffff;
      }
    }
    else {
      this_local = (AdvancedPipelinePostXFB *)&DAT_ffffffffffffffff;
    }
  }
  return (long)this_local;
}

Assistant:

virtual long Run()
	{
		GLint res;
		glGetIntegerv(GL_MAX_VERTEX_SHADER_STORAGE_BLOCKS, &res);
		if (res <= 0)
		{
			OutputNotSupported("GL_MAX_VERTEX_SHADER_STORAGE_BLOCKS <= 0");
			return NO_ERROR;
		}

		const char* const glsl_vs =
			NL "layout(location = 0) in vec4 g_position;" NL "layout(location = 1) in vec4 g_color;" NL
			   "struct Vertex {" NL "  vec4 position;" NL "  vec4 color;" NL "};" NL "out StageData {" NL
			   "  vec4 color;" NL "} g_vs_out;" NL "layout(binding = 0, std430) buffer StageData {" NL
			   "  Vertex vertex[];" NL "} g_vs_buffer;" NL "void main() {" NL "  gl_Position = g_position;" NL
			   "  g_vs_out.color = g_color;" NL "  g_vs_buffer.vertex[gl_VertexID].position = g_position;" NL
			   "  g_vs_buffer.vertex[gl_VertexID].color = g_color;" NL "}";

		const char* const glsl_fs =
			NL "in StageData {" NL "  vec4 color;" NL "} g_fs_in;" NL "layout(location = 0) out vec4 g_color;" NL
			   "void main() {" NL "  g_color = g_fs_in.color;" NL "}";

		m_program[0] = CreateProgram(glsl_vs, glsl_fs);
		/* setup xfb varyings */
		{
			const char* const var[2] = { "gl_Position", "StageData.color" };
			glTransformFeedbackVaryings(m_program[0], 2, var, GL_INTERLEAVED_ATTRIBS);
		}
		glLinkProgram(m_program[0]);
		if (!CheckProgram(m_program[0]))
			return ERROR;

		const char* const glsl_cs =
			NL "layout(local_size_x = 3) in;" NL "struct Vertex {" NL "  vec4 position;" NL "  vec4 color;" NL "};" NL
			   "layout(binding = 3, std430) buffer Buffer {" NL "  Vertex g_vertex[3];" NL "};" NL
			   "uniform vec4 g_color1 = vec4(0, 0, 1, 0);" NL "uniform int g_two = 2;" NL
			   "void UpdateVertex2(int i) {" NL "  g_vertex[i].color -= vec4(-1, 1, 0, 0);" NL "}" NL "void main() {" NL
			   "  switch (gl_GlobalInvocationID.x) {" NL
			   "    case 0: g_vertex[gl_GlobalInvocationID.x].color += vec4(1, 0, 0, 0); break;" NL
			   "    case 1: g_vertex[1].color += g_color1; break;" NL "    case 2: UpdateVertex2(g_two); break;" NL
			   "    default: return;" NL "  }" NL "}";
		m_program[1] = CreateComputeProgram(glsl_cs);
		glLinkProgram(m_program[1]);
		if (!CheckProgram(m_program[1]))
			return ERROR;

		glGenBuffers(1, &m_storage_buffer);
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_storage_buffer);
		glBufferData(GL_SHADER_STORAGE_BUFFER, 3 * sizeof(vec4) * 2, NULL, GL_STATIC_COPY);

		glGenBuffers(1, &m_xfb_buffer);
		glBindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 0, m_xfb_buffer);
		glBufferData(GL_TRANSFORM_FEEDBACK_BUFFER, 3 * sizeof(vec4) * 2, NULL, GL_STREAM_COPY);

		const float in_data[3 * 8] = { -1, -1, 0, 1, 0, 1, 0, 1, 3, -1, 0, 1, 0, 1, 0, 1, -1, 3, 0, 1, 0, 1, 0, 1 };
		glGenBuffers(1, &m_vertex_buffer);
		glBindBuffer(GL_ARRAY_BUFFER, m_vertex_buffer);
		glBufferData(GL_ARRAY_BUFFER, sizeof(in_data), in_data, GL_STATIC_DRAW);
		glBindBuffer(GL_ARRAY_BUFFER, 0);

		glGenVertexArrays(1, &m_vertex_array);
		glBindVertexArray(m_vertex_array);
		glBindBuffer(GL_ARRAY_BUFFER, m_vertex_buffer);
		glVertexAttribPointer(0, 4, GL_FLOAT, GL_FALSE, 2 * sizeof(vec4), 0);
		glVertexAttribPointer(1, 4, GL_FLOAT, GL_FALSE, 2 * sizeof(vec4), reinterpret_cast<void*>(sizeof(vec4)));
		glBindBuffer(GL_ARRAY_BUFFER, 0);
		glEnableVertexAttribArray(0);
		glEnableVertexAttribArray(1);
		glBindVertexArray(0);

		glClear(GL_COLOR_BUFFER_BIT);
		glUseProgram(m_program[0]);
		glBindVertexArray(m_vertex_array);
		glBeginTransformFeedback(GL_TRIANGLES);
		glDrawArrays(GL_TRIANGLES, 0, 3);
		glEndTransformFeedback();

		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 3, m_xfb_buffer);
		glUseProgram(m_program[1]);
		glDispatchCompute(1, 1, 1);

		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);

		/* validate storage buffer */
		{
			float data[3 * 8];
			glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_storage_buffer);
			glGetBufferSubData(GL_SHADER_STORAGE_BUFFER, 0, sizeof(data), data);
			if (memcmp(data, in_data, sizeof(data)) != 0)
			{
				Output("Data in shader storage buffer is incorrect.\n");
				return ERROR;
			}
		}
		/* validate xfb buffer */
		{
			const float ref_data[3 * 8] = {
				-1, -1, 0, 1, 1, 1, 0, 1, 3, -1, 0, 1, 0, 1, 1, 1, -1, 3, 0, 1, 1, 0, 0, 1
			};

			float data[3 * 8];
			glGetBufferSubData(GL_TRANSFORM_FEEDBACK_BUFFER, 0, sizeof(data), data);
			if (memcmp(data, ref_data, sizeof(data)) != 0)
			{
				Output("Data in xfb buffer is incorrect.\n");
				return ERROR;
			}
		}
		if (!ValidateReadBuffer(0, 0, getWindowWidth(), getWindowHeight(), vec4(0, 1, 0, 1)))
		{
			return ERROR;
		}
		return NO_ERROR;
	}